

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_stream.c
# Opt level: O0

void stream_read_alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  asterism_stream_s *stream;
  uv_buf_t *buf_local;
  size_t suggested_size_local;
  uv_handle_t *handle_local;
  
  if (handle[0x2f].next_closing == (uv_handle_t *)0x0) {
    buf->base = (char *)((long)handle[2].handle_queue +
                        (ulong)*(uint *)(handle[0x2d].handle_queue + 1) + 0x28);
    buf->len = (ulong)(0x1000 - *(int *)(handle[0x2d].handle_queue + 1));
  }
  else {
    (*(code *)handle[0x2f].next_closing)(handle,suggested_size,buf);
  }
  return;
}

Assistant:

static void stream_read_alloc_cb(
    uv_handle_t *handle,
    size_t suggested_size,
    uv_buf_t *buf)
{
    struct asterism_stream_s *stream = __CONTAINER_PTR(struct asterism_stream_s, socket, handle);
    if (stream->_alloc_cb)
    {
        stream->_alloc_cb(handle, suggested_size, buf);
    }
    else
    {
        buf->base = stream->buffer + stream->buffer_len;
        buf->len = ASTERISM_TCP_BLOCK_SIZE - stream->buffer_len;
    }
}